

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkEwtSetSV(N_Vector ycur,N_Vector weight,void *arkode_mem)

{
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar1;
  ARKodeMem ark_mem;
  int local_4;
  
  N_VAbs(in_RDI,*(undefined8 *)(in_RDX + 0x248));
  N_VLinearSum(*(undefined8 *)(in_RDX + 0x20),0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x248),
               *(undefined8 *)(in_RDX + 0x30),*(undefined8 *)(in_RDX + 0x248));
  if ((*(int *)(in_RDX + 0x38) == 0) ||
     (dVar1 = (double)N_VMin(*(undefined8 *)(in_RDX + 0x248)), 0.0 < dVar1)) {
    N_VInv(*(undefined8 *)(in_RDX + 0x248),in_RSI);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int arkEwtSetSV(N_Vector ycur, N_Vector weight, void* arkode_mem)
{
  ARKodeMem ark_mem = (ARKodeMem)arkode_mem;
  N_VAbs(ycur, ark_mem->tempv1);
  N_VLinearSum(ark_mem->reltol, ark_mem->tempv1, ONE, ark_mem->Vabstol,
               ark_mem->tempv1);
  if (ark_mem->atolmin0)
  {
    if (N_VMin(ark_mem->tempv1) <= ZERO) { return (-1); }
  }
  N_VInv(ark_mem->tempv1, weight);
  return (0);
}